

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::thrift::BatchSubmitResponse::printTo(BatchSubmitResponse *this,ostream *out)

{
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"BatchSubmitResponse(",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(out,"ok=",3);
  apache::thrift::to_string<bool>(&local_38,&this->ok);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void BatchSubmitResponse::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BatchSubmitResponse(";
  out << "ok=" << to_string(ok);
  out << ")";
}